

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-coalesce.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Boolean BVar2;
  ulong uVar3;
  int extraout_EDX;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  MA_AccessIndex index [10];
  Integer handle [10];
  MA_AccessIndex MStack_c8;
  MA_AccessIndex local_c0;
  MA_AccessIndex local_b8;
  MA_AccessIndex local_b0;
  MA_AccessIndex local_a8 [6];
  Integer local_78;
  Integer local_70;
  Integer local_68;
  Integer local_60;
  Integer local_58 [7];
  
  lVar6 = 1000;
  uVar5 = 0;
  BVar2 = MA_init(1000,0,0x400);
  if (BVar2 != 0) {
    uVar3 = MA_inquire_heap(0x3e9);
    iVar4 = (int)uVar3;
    printf("MA_inquire_heap(MT_INT) = %d\n",uVar3 & 0xffffffff);
    puts("# Allocating 4 memory segments");
    lVar6 = (long)(iVar4 / 5);
    MA_alloc_get(0x3e9,lVar6,"heap0",&local_78,&MStack_c8);
    MA_alloc_get(0x3e9,lVar6,"heap1",&local_70,&local_c0);
    MA_alloc_get(0x3e9,lVar6,"heap2",&local_68,&local_b8);
    MA_alloc_get(0x3e9,lVar6,"heap3",&local_60,&local_b0);
    puts("# Deleting 2 non-adjacent memory segments");
    MA_free_heap(local_78);
    MA_free_heap(local_68);
    puts("# Attempting to allocate memory segment -- should fail");
    iVar1 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar1 = iVar4;
    }
    MA_alloc_get(0x3e9,(long)(iVar1 >> 2),"heap4",local_58,local_a8);
    puts("# Freeing some memory and trying again -- should succeed");
    MA_free_heap(local_70);
    MA_alloc_get(0x3e9,(long)(iVar1 >> 2),"heap4",local_58,local_a8);
    puts("# Printing stats for allocated blocks -- should be two active");
    MA_summarize_allocated_blocks();
    return 0;
  }
  main_cold_1();
  if (ma_initialized == '\x01') {
    builtin_strncpy(ma_ebuf,"MA already initialized",0x17);
    ma_error(EL_Nonfatal,ET_Internal,"MAi_inform_base",ma_ebuf);
    iVar1 = 0;
  }
  else if (lVar6 - 1000U < 0x11) {
    *(undefined8 *)(&fde_00111280 + lVar6 * 2) = uVar5;
    *(int *)(lVar6 * 4 + 0x1122b0) = extraout_EDX - (int)uVar5;
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    sprintf(ma_ebuf,"invalid datatype: %ld",lVar6);
    ma_error(EL_Nonfatal,ET_Internal,"MAi_inform_base",ma_ebuf);
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    Integer        bytes_heap;
    Integer        bytes_stack;
    int            howmany;
    Boolean        ok;
                  
    Integer        handle[MAXHANDLES];
    MA_AccessIndex index[MAXHANDLES];

    /* set sizes of heap and stack */
    bytes_heap = 1024;
    bytes_stack = 0;

    /* initialize */
    ok = MA_init(MT_CHAR, bytes_stack, bytes_heap);
    if (!ok)
    {
        (void)fprintf(stderr, "MA_init failed; punting\n");
        exit(1);
    }

    howmany = MA_inquire_heap(MT_INT);
    (void)printf("MA_inquire_heap(MT_INT) = %d\n", howmany);

    printf("# Allocating 4 memory segments\n");
    MA_alloc_get(MT_INT, howmany/5, "heap0", &handle[0], &index[0]);
    MA_alloc_get(MT_INT, howmany/5, "heap1", &handle[1], &index[1]);
    MA_alloc_get(MT_INT, howmany/5, "heap2", &handle[2], &index[2]);
    MA_alloc_get(MT_INT, howmany/5, "heap3", &handle[3], &index[3]);

    printf("# Deleting 2 non-adjacent memory segments\n");
    MA_free_heap(handle[0]);
    MA_free_heap(handle[2]);

    printf("# Attempting to allocate memory segment -- should fail\n");
    MA_alloc_get(MT_INT, howmany/4, "heap4", &handle[4], &index[4]);

    printf("# Freeing some memory and trying again -- should succeed\n");
    MA_free_heap(handle[1]);
    MA_alloc_get(MT_INT, howmany/4, "heap4", &handle[4], &index[4]);

    printf("# Printing stats for allocated blocks -- should be two active\n");
    MA_summarize_allocated_blocks();

    return 0;
}